

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstraintPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>const&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,Token *args_2,SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_3,
          NameSyntax *args_4,Token *args_5)

{
  Token keyword;
  Token semi;
  ConstraintPrototypeSyntax *pCVar1;
  Info *in_RCX;
  NameSyntax *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  ConstraintPrototypeSyntax *in_R9;
  Info *unaff_retaddr;
  long in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pCVar1 = (ConstraintPrototypeSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  keyword.info = in_RCX;
  keyword.kind = (short)in_R8;
  keyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  keyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  semi.info = unaff_retaddr;
  semi.kind = (short)in_RDI;
  semi._2_1_ = (char)((ulong)in_RDI >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  semi.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX->location,
             (TokenList *)in_RCX->rawTextPtr,keyword,
             *(SyntaxList<slang::syntax::ClassSpecifierSyntax> **)(in_stack_00000008 + 8),in_RSI,
             semi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }